

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint16_t FACTWaveBank_GetWaveIndex(FACTWaveBank *pWaveBank,char *szFriendlyName)

{
  int iVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  
  uVar2 = 0xffff;
  if ((pWaveBank != (FACTWaveBank *)0x0) && (pWaveBank->waveBankNames != (char *)0x0)) {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    uVar2 = 0xffff;
    if (pWaveBank->entryCount != 0) {
      uVar3 = 0;
      do {
        iVar1 = SDL_strncmp(szFriendlyName,szFriendlyName,0x40);
        uVar2 = uVar3;
        if (iVar1 == 0) break;
        uVar3 = uVar3 + 1;
        uVar2 = 0xffff;
      } while ((uint)uVar3 < pWaveBank->entryCount);
    }
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  }
  return uVar2;
}

Assistant:

uint16_t FACTWaveBank_GetWaveIndex(
	FACTWaveBank *pWaveBank,
	const char *szFriendlyName
) {
	uint16_t i;
	char *curName;
	if (pWaveBank == NULL || pWaveBank->waveBankNames == NULL)
	{
		return FACTINDEX_INVALID;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	curName = pWaveBank->waveBankNames;
	for (i = 0; i < pWaveBank->entryCount; i += 1, curName += 64)
	{
		if (FAudio_strncmp(szFriendlyName, curName, 64) == 0)
		{
			FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);

	return FACTINDEX_INVALID;
}